

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O2

size_type __thiscall wabt::string_view::find_last_of(string_view *this,string_view s,size_type pos)

{
  ulong uVar1;
  char *pcVar2;
  reverse_iterator<const_char_*> local_28;
  reverse_iterator<const_char_*> local_20;
  reverse_iterator iter;
  
  uVar1 = this->size_ - 1;
  if (pos <= uVar1) {
    uVar1 = pos;
  }
  local_28.current = this->data_;
  local_20.current = local_28.current + uVar1 + 1;
  std::find_first_of<std::reverse_iterator<char_const*>,char_const*>
            (&local_20,&local_28,s.data_,s.data_ + s.size_);
  pcVar2 = (char *)0xffffffffffffffff;
  if (iter.current != this->data_) {
    pcVar2 = iter.current + ~(ulong)this->data_;
  }
  return (size_type)pcVar2;
}

Assistant:

string_view::size_type string_view::find_last_of(string_view s,
                                                 size_type pos) const noexcept {
  pos = std::min(pos, size_ - 1);
  reverse_iterator iter = std::find_first_of(
      reverse_iterator(begin() + (pos + 1)), rend(), s.begin(), s.end());
  return iter == rend() ? npos : (rend() - iter - 1);
}